

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits,uint32_t page_size)

{
  Module *this_00;
  uint64_t uVar1;
  pointer *__ptr;
  undefined1 local_58 [48];
  
  GetLocation((Location *)(local_58 + 0x10),this);
  std::make_unique<wabt::MemoryModuleField,wabt::Location>((Location *)local_58);
  *(undefined4 *)(local_58._0_8_ + 0x6f) = *(undefined4 *)((long)&page_limits->max + 7);
  uVar1 = page_limits->max;
  *(uint64_t *)(local_58._0_8_ + 0x60) = page_limits->initial;
  *(uint64_t *)(local_58._0_8_ + 0x68) = uVar1;
  *(uint32_t *)(local_58._0_8_ + 0x78) = page_size;
  this_00 = this->module_;
  if (*(char *)(local_58._0_8_ + 0x71) == '\x01') {
    (this_00->features_used).threads = true;
  }
  local_58._8_8_ = local_58._0_8_;
  local_58._0_8_ = (long *)0x0;
  Module::AppendField(this_00,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                               *)(local_58 + 8));
  if ((long *)local_58._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._8_8_ + 8))();
  }
  local_58._8_8_ = (char *)0x0;
  if ((long *)local_58._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index,
                                const Limits* page_limits,
                                uint32_t page_size) {
  auto field = std::make_unique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  memory.page_size = page_size;
  if (memory.page_limits.is_shared) {
    module_->features_used.threads = true;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}